

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O0

gdImagePtr gdImageCreateFromTgaCtx(gdIOCtx *ctx)

{
  int iVar1;
  oTga *tga_00;
  int *piStack_40;
  int a;
  int *tpix;
  int y;
  int x;
  gdImagePtr image;
  oTga *tga;
  int bitmap_caret;
  gdIOCtx *ctx_local;
  
  tga._4_4_ = 0;
  tga_00 = (oTga *)gdMalloc(0x38);
  if (tga_00 == (oTga *)0x0) {
    ctx_local = (gdIOCtx *)0x0;
  }
  else {
    tga_00->bitmap = (int *)0x0;
    tga_00->ident = (char *)0x0;
    iVar1 = read_header_tga(ctx,tga_00);
    if (iVar1 < 0) {
      free_tga(tga_00);
      ctx_local = (gdIOCtx *)0x0;
    }
    else {
      iVar1 = read_image_tga(ctx,tga_00);
      if (iVar1 < 0) {
        free_tga(tga_00);
        ctx_local = (gdIOCtx *)0x0;
      }
      else {
        ctx_local = (gdIOCtx *)gdImageCreateTrueColor(tga_00->width,tga_00->height);
        if ((gdImagePtr)ctx_local == (gdImagePtr)0x0) {
          free_tga(tga_00);
          ctx_local = (gdIOCtx *)0x0;
        }
        else {
          if (tga_00->alphabits != '\0') {
            gdImageAlphaBlending((gdImagePtr)ctx_local,0);
            gdImageSaveAlpha((gdImagePtr)ctx_local,1);
          }
          for (tpix._0_4_ = 0; (int)tpix < tga_00->height; tpix._0_4_ = (int)tpix + 1) {
            piStack_40 = ((gdImagePtr)ctx_local)->tpixels[(int)tpix];
            for (tpix._4_4_ = 0; tpix._4_4_ < tga_00->width; tpix._4_4_ = tpix._4_4_ + 1) {
              if (tga_00->bits == '\x18') {
                *piStack_40 = tga_00->bitmap[tga._4_4_ + 2] * 0x10000 +
                              tga_00->bitmap[tga._4_4_ + 1] * 0x100 + tga_00->bitmap[tga._4_4_];
                tga._4_4_ = tga._4_4_ + 3;
              }
              else if ((tga_00->bits == ' ') && (tga_00->alphabits != '\0')) {
                *piStack_40 = (0x7f - (tga_00->bitmap[tga._4_4_ + 3] >> 1)) * 0x1000000 +
                              tga_00->bitmap[tga._4_4_ + 2] * 0x10000 +
                              tga_00->bitmap[tga._4_4_ + 1] * 0x100 + tga_00->bitmap[tga._4_4_];
                tga._4_4_ = tga._4_4_ + 4;
              }
              piStack_40 = piStack_40 + 1;
            }
          }
          if ((tga_00->flipv == '\0') || (tga_00->fliph == '\0')) {
            if (tga_00->flipv == '\0') {
              if (tga_00->fliph != '\0') {
                gdImageFlipHorizontal((gdImagePtr)ctx_local);
              }
            }
            else {
              gdImageFlipVertical((gdImagePtr)ctx_local);
            }
          }
          else {
            gdImageFlipBoth((gdImagePtr)ctx_local);
          }
          free_tga(tga_00);
        }
      }
    }
  }
  return (gdImagePtr)ctx_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromTgaCtx(gdIOCtx* ctx)
{
	int bitmap_caret = 0;
	oTga *tga = NULL;
	/*	int pixel_block_size = 0;
		int image_block_size = 0; */
	volatile gdImagePtr image = NULL;
	int x = 0;
	int y = 0;

	tga = (oTga *) gdMalloc(sizeof(oTga));
	if (!tga) {
		return NULL;
	}

	tga->bitmap = NULL;
	tga->ident = NULL;

	if (read_header_tga(ctx, tga) < 0) {
		free_tga(tga);
		return NULL;
	}

	/*TODO: Will this be used?
		pixel_block_size = tga->bits / 8;
		image_block_size = (tga->width * tga->height) * pixel_block_size;
	*/

	if (read_image_tga(ctx, tga) < 0) {
		free_tga(tga);
		return NULL;
	}

	image = gdImageCreateTrueColor((int)tga->width, (int)tga->height );

	if (image == 0) {
		free_tga( tga );
		return NULL;
	}

	/*!	\brief Populate GD image object
	 *  Copy the pixel data from our tga bitmap buffer into the GD image
	 *  Disable blending and save the alpha channel per default
	 */
	if (tga->alphabits) {
		gdImageAlphaBlending(image, 0);
		gdImageSaveAlpha(image, 1);
	}

	/* TODO: use alphabits as soon as we support 24bit and other alpha bps (ie != 8bits) */
	for (y = 0; y < tga->height; y++) {
		register int *tpix = image->tpixels[y];
		for ( x = 0; x < tga->width; x++, tpix++) {
			if (tga->bits == TGA_BPP_24) {
				*tpix = gdTrueColor(tga->bitmap[bitmap_caret + 2], tga->bitmap[bitmap_caret + 1], tga->bitmap[bitmap_caret]);
				bitmap_caret += 3;
			} else if (tga->bits == TGA_BPP_32 && tga->alphabits) {
				register int a = tga->bitmap[bitmap_caret + 3];

				*tpix = gdTrueColorAlpha(tga->bitmap[bitmap_caret + 2], tga->bitmap[bitmap_caret + 1], tga->bitmap[bitmap_caret], gdAlphaMax - (a >> 1));
				bitmap_caret += 4;
			}
		}
	}

	if (tga->flipv && tga->fliph) {
		gdImageFlipBoth(image);
	} else if (tga->flipv) {
		gdImageFlipVertical(image);
	} else if (tga->fliph) {
		gdImageFlipHorizontal(image);
	}

	free_tga(tga);

	return image;
}